

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_linux.cc
# Opt level: O0

void __thiscall rcdiscover::SocketLinux::bindImpl(SocketLinux *this,sockaddr_in *addr)

{
  int iVar1;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  int unaff_retaddr;
  string *in_stack_00000008;
  SocketException *in_stack_00000010;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  iVar1 = bind(*(int *)(in_RDI + 0x20),(sockaddr *)in_RSI,0x10);
  if (iVar1 == -1) {
    uVar2 = __cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    __errno_location();
    SocketException::SocketException(in_stack_00000010,in_stack_00000008,unaff_retaddr);
    __cxa_throw(uVar2,&SocketException::typeinfo,SocketException::~SocketException);
  }
  return;
}

Assistant:

void SocketLinux::bindImpl(const ::sockaddr_in& addr)
{
  if (::bind(sock_,
             reinterpret_cast<const sockaddr *>(&addr),
             sizeof(sockaddr)) == -1)
  {
    throw SocketException("Error while binding to socket", errno);
  }
}